

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

void printResourceList(void)

{
  FILE *pFVar1;
  undefined8 uVar2;
  long *plVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  pFVar1 = _stdout;
  uVar2 = beagleGetVersion();
  fprintf(pFVar1,"BEAGLE version %s\n",uVar2);
  pFVar1 = _stdout;
  uVar2 = beagleGetCitation();
  fprintf(pFVar1,"%s\n",uVar2);
  plVar3 = (long *)beagleGetResourceList();
  fwrite("Available resources:\n",0x15,1,_stdout);
  lVar4 = 0;
  for (uVar5 = 0; (long)uVar5 < (long)(int)plVar3[1]; uVar5 = uVar5 + 1) {
    fprintf(_stdout,"\tResource %i:\n\t\tName : %s\n",uVar5 & 0xffffffff,
            *(undefined8 *)(*plVar3 + lVar4));
    fprintf(_stdout,"\t\tDesc : %s\n",*(undefined8 *)(*plVar3 + 8 + lVar4));
    fwrite("\t\tFlags:",8,1,_stdout);
    printFlags(*(long *)(*plVar3 + 0x10 + lVar4));
    fputc(10,_stdout);
    lVar4 = lVar4 + 0x20;
  }
  fputc(10,_stdout);
  exit(0);
}

Assistant:

void printResourceList() {
    // print version and citation info
    fprintf(stdout, "BEAGLE version %s\n", beagleGetVersion());
    fprintf(stdout, "%s\n", beagleGetCitation());     

    // print resource list
    BeagleResourceList* rList;
    rList = beagleGetResourceList();
    fprintf(stdout, "Available resources:\n");
    for (int i = 0; i < rList->length; i++) {
        fprintf(stdout, "\tResource %i:\n\t\tName : %s\n", i, rList->list[i].name);
        fprintf(stdout, "\t\tDesc : %s\n", rList->list[i].description);
        fprintf(stdout, "\t\tFlags:");
        printFlags(rList->list[i].supportFlags);
        fprintf(stdout, "\n");
    }    
    fprintf(stdout, "\n");
    std::exit(0);
}